

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::ApproxQuantileState,duckdb::hugeint_t,duckdb::ApproxQuantileScalarOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  VectorType VVar1;
  bool bVar2;
  ValidityMask *input_mask_p;
  UnifiedVectorFormat *in_RCX;
  AggregateInputData *in_RSI;
  Vector *in_RDI;
  UnifiedVectorFormat idata_2;
  hugeint_t *idata_1;
  AggregateUnaryInput input_data;
  hugeint_t *idata;
  idx_t in_stack_ffffffffffffff28;
  AggregateUnaryInput *in_stack_ffffffffffffff30;
  UnifiedVectorFormat *this;
  hugeint_t *in_stack_ffffffffffffff38;
  ApproxQuantileState *in_stack_ffffffffffffff40;
  SelectionVector *in_stack_ffffffffffffff48;
  ValidityMask *in_stack_ffffffffffffff50;
  idx_t in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff64;
  AggregateInputData *in_stack_ffffffffffffff68;
  hugeint_t *in_stack_ffffffffffffff70;
  idx_t in_stack_ffffffffffffff78;
  ApproxQuantileState *in_stack_ffffffffffffff80;
  AggregateInputData *in_stack_ffffffffffffff88;
  hugeint_t *in_stack_ffffffffffffff90;
  AggregateUnaryInput local_40;
  hugeint_t *local_28;
  UnifiedVectorFormat *local_20;
  AggregateInputData *local_10;
  Vector *local_8;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  VVar1 = Vector::GetVectorType(in_RDI);
  uVar3 = CONCAT13(VVar1,(int3)in_stack_ffffffffffffff60);
  if (VVar1 == FLAT_VECTOR) {
    FlatVector::GetData<duckdb::hugeint_t>((Vector *)0x9e93c0);
    FlatVector::Validity((Vector *)0x9e9409);
    UnaryFlatUpdateLoop<duckdb::ApproxQuantileState,duckdb::hugeint_t,duckdb::ApproxQuantileScalarOperation>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78,(ValidityMask *)in_stack_ffffffffffffff70);
  }
  else if (VVar1 == CONSTANT_VECTOR) {
    bVar2 = ApproxQuantileOperation::IgnoreNull();
    if ((!bVar2) || (bVar2 = ConstantVector::IsNull((Vector *)0x9e933a), !bVar2)) {
      local_28 = ConstantVector::GetData<duckdb::hugeint_t>((Vector *)0x9e9352);
      input_mask_p = ConstantVector::Validity(local_8);
      AggregateUnaryInput::AggregateUnaryInput(&local_40,local_10,input_mask_p);
      ApproxQuantileOperation::
      ConstantOperation<duckdb::hugeint_t,duckdb::ApproxQuantileState,duckdb::ApproxQuantileScalarOperation>
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28);
    }
  }
  else {
    this = (UnifiedVectorFormat *)&stack0xffffffffffffff70;
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(this);
    duckdb::Vector::ToUnifiedFormat((ulong)local_8,local_20);
    UnifiedVectorFormat::GetData<duckdb::hugeint_t>((UnifiedVectorFormat *)&stack0xffffffffffffff70)
    ;
    UnaryUpdateLoop<duckdb::ApproxQuantileState,duckdb::hugeint_t,duckdb::ApproxQuantileScalarOperation>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               (ApproxQuantileState *)CONCAT44(in_stack_ffffffffffffff64,uVar3),
               in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    UnifiedVectorFormat::~UnifiedVectorFormat(this);
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}